

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int detect_form(archive_read *a,int *is_form_d)

{
  byte bVar1;
  bool bVar2;
  ssize_t sVar3;
  int iVar4;
  byte *b;
  ulong uVar5;
  void *pvVar6;
  ssize_t sVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int local_68;
  int local_64;
  ssize_t avail;
  byte *local_50;
  archive_read *local_48;
  ssize_t nl;
  ulong local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_48 = a;
  b = (byte *)__archive_read_ahead(a,1,&avail);
  if (b == (byte *)0x0) {
    return -1;
  }
  local_64 = 0;
  iVar4 = 0;
  local_68 = 0;
  lVar16 = avail;
LAB_0034fe3b:
  local_50 = (byte *)CONCAT44(local_50._4_4_,iVar4);
  do {
    uVar14 = avail;
    if (avail == 0) {
      nl = 0;
      uVar5 = 0;
    }
    else {
      uVar5 = get_line_size((char *)b,avail,&nl);
    }
    bVar2 = false;
    while (nl == 0) {
      if ((bVar2) || (uVar14 != uVar5)) goto LAB_0035027d;
      if (0xfffff < (long)uVar14) goto LAB_0035026e;
      uVar5 = (ulong)((int)lVar16 + 0x3ffU & 0xfffffc00);
      pvVar6 = __archive_read_ahead(local_48,uVar5 << (uVar5 < lVar16 + 0xa0U),&avail);
      if (pvVar6 == (void *)0x0) {
        if (avail <= lVar16) {
          uVar5 = 0;
          goto LAB_0035027d;
        }
        pvVar6 = __archive_read_ahead(local_48,avail,&avail);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      sVar3 = avail;
      b = (byte *)((long)pvVar6 + (lVar16 - uVar14));
      uVar15 = avail - (lVar16 - uVar14);
      avail = uVar15;
      sVar7 = get_line_size((char *)((long)pvVar6 + lVar16),uVar15 - uVar14,&nl);
      uVar5 = 0;
      if (-1 < sVar7) {
        uVar5 = uVar14;
      }
      uVar5 = uVar5 + sVar7;
      uVar14 = uVar15;
      lVar16 = sVar3;
    }
    if ((long)uVar5 < 1) goto LAB_0035027d;
    uVar15 = ~nl;
    if ((int)local_50 != 0) {
      iVar4 = bid_keyword_list((char *)b,uVar5,0,0);
      if (iVar4 < 1) goto LAB_0035026e;
      b = b + uVar5;
      iVar4 = (int)local_50;
      if ((b[uVar15] != 0x5c) && (iVar4 = 0, (int)local_50 == 1)) {
        if (1 < local_64) goto LAB_00350291;
        local_64 = local_64 + 1;
        iVar4 = 0;
      }
      avail = uVar14 - uVar5;
      goto LAB_0034fe3b;
    }
    pbVar13 = b + uVar5;
    pbVar9 = b + uVar15;
    uVar10 = uVar14;
    for (uVar12 = uVar5; uVar10 = uVar10 - 1, 0 < (long)uVar12; uVar12 = uVar12 - 1) {
      bVar1 = *b;
      if ((bVar1 != 0x20) && (uVar5 = uVar12, bVar1 != 9)) goto LAB_0034ff8b;
      b = b + 1;
      uVar14 = uVar14 - 1;
      pbVar9 = pbVar9 + 1;
      avail = uVar10;
    }
    bVar1 = *pbVar13;
    uVar5 = 0;
    b = pbVar13;
LAB_0034ff8b:
    if (((bVar1 != 10) && (bVar1 != 0xd)) && (bVar1 != 0x23)) break;
    b = b + uVar5;
    if ((long)uVar12 < 1) {
      uVar12 = 0;
    }
    avail = uVar14 - uVar12;
  } while( true );
  if (bVar1 != 0x2f) {
    lVar8 = -nl;
    local_50 = b + uVar5;
    uVar10 = 0;
    if (0 < (long)uVar12) {
      uVar10 = uVar12;
    }
    bVar2 = true;
    for (pbVar13 = b; pbVar13 < local_50; pbVar13 = pbVar13 + 1) {
      bVar1 = *pbVar13;
      if (bid_entry_safe_char[bVar1] == '\0') {
        if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003500cc;
        break;
      }
      uVar10 = uVar10 - 1;
      bVar2 = false;
    }
    if (bVar2) {
LAB_003500cc:
      if ((((b <= local_50 + lVar8 + -2) && (local_50[lVar8 + -1] == 0x5c)) &&
          ((bVar1 = local_50[lVar8 + -2], bVar1 == 9 || (bVar1 == 0x20)))) ||
         ((b <= local_50 + lVar8 + -1 && (local_50[lVar8 + -1] == 0x5c)))) goto LAB_0035027d;
      lVar11 = 0;
      uVar10 = 0;
      if (0 < (long)uVar12) {
        uVar10 = uVar12;
      }
      bVar2 = false;
      for (pbVar9 = pbVar9 + uVar10 + ((long)uVar12 >> 0x3f & uVar12); b <= pbVar9;
          pbVar9 = pbVar9 + -1) {
        bVar1 = *pbVar9;
        if ((bVar1 == 9) || (bVar1 == 0x20)) break;
        if (bid_entry_safe_char[bVar1] == '\0') goto LAB_0035027d;
        if (bVar1 == 0x2f) {
          bVar2 = true;
        }
        lVar11 = lVar11 + 1;
      }
      if ((((int)lVar11 == 0) || (!bVar2)) || (pbVar9[1] == 0x2f)) goto LAB_0035027d;
      bVar2 = false;
      uVar10 = 0;
      if (0 < (long)uVar12) {
        uVar10 = uVar12;
      }
      uVar10 = (lVar8 + uVar10) - lVar11;
      iVar4 = 1;
      pbVar13 = b;
    }
    else {
      iVar4 = 0;
      bVar2 = true;
    }
    local_38 = uVar15;
    iVar4 = bid_keyword_list((char *)pbVar13,uVar10,0,iVar4);
    if (iVar4 < 0) goto LAB_0035027d;
    if (local_68 == 1) {
      if ((bool)(bVar2 & iVar4 != 0)) {
        local_68 = 1;
        goto LAB_0035027d;
      }
LAB_00350227:
      if (bVar2) {
LAB_0035022c:
        if (local_50[local_38] == 0x5c) {
          iVar4 = 1;
          goto LAB_0035024d;
        }
      }
    }
    else {
      if (local_68 != 0) goto LAB_00350227;
      local_68 = 1;
      if (bVar2) {
        local_68 = -(uint)(iVar4 != 0);
        goto LAB_0035022c;
      }
    }
    if (1 < local_64) goto LAB_00350291;
    local_64 = local_64 + 1;
    iVar4 = 0;
    goto LAB_0035024d;
  }
  if (uVar5 < 5) goto LAB_0035027d;
  iVar4 = strncmp((char *)b,"/set",4);
  if (iVar4 == 0) {
    pbVar13 = b + 4;
    lVar8 = uVar5 - 4;
    iVar4 = 0;
LAB_003501f4:
    iVar4 = bid_keyword_list((char *)pbVar13,lVar8,iVar4,0);
    if (0 < iVar4) {
      iVar4 = (uint)(b[uVar15 + uVar5] == 0x5c) * 2;
LAB_0035024d:
      b = b + uVar5;
      if ((long)uVar12 < 1) {
        uVar12 = 0;
      }
      avail = uVar14 - uVar12;
      goto LAB_0034fe3b;
    }
  }
  else if ((6 < uVar5) && (iVar4 = strncmp((char *)b,"/unset",6), iVar4 == 0)) {
    pbVar13 = b + 6;
    lVar8 = uVar5 - 6;
    iVar4 = 1;
    goto LAB_003501f4;
  }
LAB_0035026e:
  uVar5 = 0xffffffffffffffff;
LAB_0035027d:
  if (local_64 < 3) {
    if (local_64 < 1) {
      return 0;
    }
    if (uVar5 != 0) {
      return 0;
    }
  }
LAB_00350291:
  if ((is_form_d != (int *)0x0) && (local_68 == 1)) {
    *is_form_d = 1;
  }
  return 0x20;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}